

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandDumpEquiv(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint nConfs;
  Io_FileType_t FileType;
  long lVar4;
  Abc_Ntk_t *pNtk;
  char *pcVar5;
  uint fVerbose;
  bool bVar6;
  uint fByName;
  Abc_Ntk_t **ppAVar7;
  char *pcVar8;
  Abc_Ntk_t *pNtks [2];
  Abc_Ntk_t *local_48;
  Abc_Ntk_t *pAStack_40;
  char *local_38;
  
  local_48 = (Abc_Ntk_t *)0x0;
  pAStack_40 = (Abc_Ntk_t *)0x0;
  fVerbose = 0;
  Extra_UtilGetoptReset();
  fByName = 1;
  nConfs = 1000;
LAB_00260d03:
  do {
    while (iVar3 = Extra_UtilGetopt(argc,argv,"Cnvh"), iVar2 = globalUtilOptind, iVar3 == 0x76) {
      fVerbose = fVerbose ^ 1;
    }
    if (iVar3 == -1) {
      lVar4 = (long)globalUtilOptind;
      if (globalUtilOptind + 3 == argc) {
        local_38 = argv[lVar4 + 2];
        pcVar5 = argv[lVar4 + 1];
        ppAVar7 = &local_48;
        pcVar8 = argv[lVar4];
        bVar6 = true;
        while( true ) {
          FileType = Io_ReadFileType(pcVar8);
          pNtk = Io_Read(pcVar8,FileType,1,0);
          *ppAVar7 = pNtk;
          if (pNtk == (Abc_Ntk_t *)0x0) break;
          Abc_NtkToAig(pNtk);
          ppAVar7 = &pAStack_40;
          bVar1 = !bVar6;
          pcVar8 = pcVar5;
          bVar6 = false;
          if (bVar1) {
            Abc_NtkDumpEquiv(&local_48,local_38,nConfs,fByName,fVerbose);
            Abc_NtkDelete(local_48);
            Abc_NtkDelete(pAStack_40);
            return 0;
          }
        }
      }
      else {
        pcVar5 = "Expecting three file names on the command line.\n";
LAB_00260e1f:
        Abc_Print(-1,pcVar5);
      }
      goto LAB_00260e37;
    }
    if (iVar3 == 0x6e) {
      fByName = fByName ^ 1;
      goto LAB_00260d03;
    }
    if (iVar3 != 0x43) goto LAB_00260e37;
    if (argc <= globalUtilOptind) {
      pcVar5 = "Command line switch \"-C\" should be followed by an integer.\n";
      goto LAB_00260e1f;
    }
    nConfs = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar2 + 1;
    if ((int)nConfs < 0) {
LAB_00260e37:
      Abc_Print(-2,
                "usage: dump_equiv [-C num] [-nvh] <file1.blif> <file2.blif> <file_dump_equiv.txt>\n"
               );
      Abc_Print(-2,"\t          computes equivalence classes of nodes in <file1> and <file2>\n");
      Abc_Print(-2,
                "\t          By default this procedure performs matching of primary inputs by name.\n"
               );
      Abc_Print(-2,
                "\t          Those inputs that cannot be matched are treated as free variables.\n");
      Abc_Print(-2,
                "\t          There is no effort to match primary outputs. Indeed, if two outputs\n")
      ;
      Abc_Print(-2,
                "\t          are equivalent, they will belong to the same equivalence class in the end.\n"
               );
      Abc_Print(-2,"\t-C num  : the maximum number of conflicts at each node [default = %d]\n",
                (ulong)nConfs);
      pcVar8 = "yes";
      pcVar5 = "yes";
      if (fByName == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-n      : enable matching of primary inputs by name [default = %s]\n",pcVar5);
      if (fVerbose == 0) {
        pcVar8 = "no";
      }
      Abc_Print(-2,"\t-v      : prints verbose information [default = %s]\n",pcVar8);
      Abc_Print(-2,"\t-h      : print the command usage\n");
      Abc_Print(-2,"\t<file1> : first network whose nodes are considered\n");
      Abc_Print(-2,"\t<file2> : second network whose nodes are considered\n");
      Abc_Print(-2,"\t<file_dump_equiv> : text file with node equivalence classes\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandDumpEquiv( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Abc_NtkDumpEquiv( Abc_Ntk_t * pNtks[2], char * pFileName, int nConfs, int fByName, int fVerbose );
    Abc_Ntk_t * pNtks[2] = {NULL};
    char * pFileName[2], * pFileNameOut;
    int c, nConfs = 1000, fByName = 1, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Cnvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            nConfs = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nConfs < 0 )
                goto usage;
            break;
        case 'n':
            fByName ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( argc != globalUtilOptind + 3 )
    {
        Abc_Print( -1, "Expecting three file names on the command line.\n" );
        goto usage;
    }
    pFileName[0] = argv[globalUtilOptind];
    pFileName[1] = argv[globalUtilOptind+1];
    pFileNameOut = argv[globalUtilOptind+2];
    for ( c = 0; c < 2; c++ )
    {
        pNtks[c] = Io_Read( pFileName[c], Io_ReadFileType(pFileName[c]), 1, 0 );
        if ( pNtks[c] == NULL )
            goto usage;
        Abc_NtkToAig( pNtks[c] );
    }
//    if ( Abc_NtkCiNum(pNtks[0]) != Abc_NtkCiNum(pNtks[1]) )
//        Abc_Print( -1, "The number of primary inputs of networks \"%s\" and \"%s\" does not match.\n", Abc_NtkName(pNtks[0]), Abc_NtkName(pNtks[1]) );
//    else if ( Abc_NtkCoNum(pNtks[0]) != Abc_NtkCoNum(pNtks[1]) )
//        Abc_Print( -1, "The number of primary outputs of networks \"%s\" and \"%s\" does not match.\n", Abc_NtkName(pNtks[0]), Abc_NtkName(pNtks[1]) );
//    else
        Abc_NtkDumpEquiv( pNtks, pFileNameOut, nConfs, fByName, fVerbose );
    Abc_NtkDelete( pNtks[0] );
    Abc_NtkDelete( pNtks[1] );
    return 0;

usage:
    Abc_Print( -2, "usage: dump_equiv [-C num] [-nvh] <file1.blif> <file2.blif> <file_dump_equiv.txt>\n" );
    Abc_Print( -2, "\t          computes equivalence classes of nodes in <file1> and <file2>\n" );
    Abc_Print( -2, "\t          By default this procedure performs matching of primary inputs by name.\n" );
    Abc_Print( -2, "\t          Those inputs that cannot be matched are treated as free variables.\n" );
    Abc_Print( -2, "\t          There is no effort to match primary outputs. Indeed, if two outputs\n" );
    Abc_Print( -2, "\t          are equivalent, they will belong to the same equivalence class in the end.\n" );
    Abc_Print( -2, "\t-C num  : the maximum number of conflicts at each node [default = %d]\n", nConfs );
    Abc_Print( -2, "\t-n      : enable matching of primary inputs by name [default = %s]\n", fByName? "yes": "no" );
    Abc_Print( -2, "\t-v      : prints verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h      : print the command usage\n");
    Abc_Print( -2, "\t<file1> : first network whose nodes are considered\n" );
    Abc_Print( -2, "\t<file2> : second network whose nodes are considered\n" );
    Abc_Print( -2, "\t<file_dump_equiv> : text file with node equivalence classes\n" );
    return 1;
}